

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::removeInternalVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  Data *this_00;
  AnchorVertex *pAVar1;
  int iVar2;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar3;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._12_4_ = 0xaaaaaaaa;
  local_48.second = edge;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->m_vertexList).d;
  local_48.first = item;
  if (this_00 != (Data *)0x0) {
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)this_00,&local_48);
    if (pNVar3 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) {
      pAVar1 = (pNVar3->value).first;
      local_58._0_8_ = pAVar1;
      if (pAVar1 != (AnchorVertex *)0x0) {
        iVar2 = (pNVar3->value).second + -1;
        local_58._8_4_ = iVar2;
        if (iVar2 == 0) {
          QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
          ::removeImpl<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                    ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                      *)&this->m_vertexList,&local_48);
          (*pAVar1->_vptr_AnchorVertex[1])(pAVar1);
        }
        else {
          local_38.first = local_48.first;
          local_38.second = local_48.second;
          local_38._12_4_ = local_48._12_4_;
          QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
          ::emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                    ((QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                      *)&this->m_vertexList,&local_38,
                     (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_58);
          if ((local_58._8_4_ == 2) &&
             ((edge == AnchorVerticalCenter || (edge == AnchorHorizontalCenter)))) {
            removeCenterAnchors(this,item,edge,true);
          }
        }
        goto LAB_005c0509;
      }
    }
  }
  removeInternalVertex();
LAB_005c0509:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeInternalVertex(QGraphicsLayoutItem *item,
                                                        Qt::AnchorPoint edge)
{
    std::pair<QGraphicsLayoutItem *, Qt::AnchorPoint> pair(item, edge);
    std::pair<AnchorVertex *, int> v = m_vertexList.value(pair);

    if (!v.first) {
        qWarning("This item with this edge is not in the graph");
        return;
    }

    v.second--;
    if (v.second == 0) {
        // Remove reference and delete vertex
        m_vertexList.remove(pair);
        delete v.first;
    } else {
        // Update reference count
        m_vertexList.insert(pair, v);

        if ((v.second == 2) &&
            ((edge == Qt::AnchorHorizontalCenter) ||
             (edge == Qt::AnchorVerticalCenter))) {
            removeCenterAnchors(item, edge, true);
        }
    }
}